

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_codec.c
# Opt level: O0

aom_codec_err_t aom_codec_control(aom_codec_ctx_t *ctx,int ctrl_id,...)

{
  char in_AL;
  int iVar1;
  aom_codec_err_t aVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  aom_codec_ctrl_fn_map_t *entry;
  undefined1 auStack_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  __va_list_tag local_38;
  aom_codec_ctrl_fn_map_t *local_20;
  int local_14;
  long local_10;
  aom_codec_err_t local_4;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  if (in_RDI == 0) {
    local_4 = AOM_CODEC_INVALID_PARAM;
  }
  else if (in_ESI == 0) {
    *(undefined4 *)(in_RDI + 0x10) = 8;
    local_4 = AOM_CODEC_INVALID_PARAM;
  }
  else if (((*(long *)(in_RDI + 8) == 0) || (*(long *)(in_RDI + 0x30) == 0)) ||
          (*(long *)(*(long *)(in_RDI + 8) + 0x28) == 0)) {
    *(undefined4 *)(in_RDI + 0x10) = 1;
    local_4 = AOM_CODEC_ERROR;
  }
  else {
    local_20 = *(aom_codec_ctrl_fn_map_t **)(*(long *)(in_RDI + 8) + 0x28);
    local_d8 = in_RDX;
    local_d0 = in_RCX;
    local_c8 = in_R8;
    local_c0 = in_R9;
    local_14 = in_ESI;
    local_10 = in_RDI;
    while (iVar1 = at_ctrl_map_end(local_20), iVar1 == 0) {
      if (local_20->ctrl_id == local_14) {
        local_38.overflow_arg_area = &stack0x00000008;
        local_38.fp_offset = 0x30;
        local_38.gp_offset = 0x10;
        local_38.reg_save_area = auStack_e8;
        aVar2 = (*local_20->fn)(*(aom_codec_alg_priv_t **)(local_10 + 0x30),&local_38);
        *(aom_codec_err_t *)(local_10 + 0x10) = aVar2;
        return *(aom_codec_err_t *)(local_10 + 0x10);
      }
      local_20 = local_20 + 1;
    }
    *(undefined4 *)(local_10 + 0x10) = 1;
    **(undefined8 **)(local_10 + 0x30) = "Invalid control ID";
    local_4 = AOM_CODEC_ERROR;
  }
  return local_4;
}

Assistant:

aom_codec_err_t aom_codec_control(aom_codec_ctx_t *ctx, int ctrl_id, ...) {
  if (!ctx) {
    return AOM_CODEC_INVALID_PARAM;
  }
  // Control ID must be non-zero.
  if (!ctrl_id) {
    ctx->err = AOM_CODEC_INVALID_PARAM;
    return AOM_CODEC_INVALID_PARAM;
  }
  if (!ctx->iface || !ctx->priv || !ctx->iface->ctrl_maps) {
    ctx->err = AOM_CODEC_ERROR;
    return AOM_CODEC_ERROR;
  }

  // "ctrl_maps" is an array of (control ID, function pointer) elements,
  // with CTRL_MAP_END as a sentinel.
  for (aom_codec_ctrl_fn_map_t *entry = ctx->iface->ctrl_maps;
       !at_ctrl_map_end(entry); ++entry) {
    if (entry->ctrl_id == ctrl_id) {
      va_list ap;
      va_start(ap, ctrl_id);
      ctx->err = entry->fn((aom_codec_alg_priv_t *)ctx->priv, ap);
      va_end(ap);
      return ctx->err;
    }
  }
  ctx->err = AOM_CODEC_ERROR;
  ctx->priv->err_detail = "Invalid control ID";
  return AOM_CODEC_ERROR;
}